

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compareDwa.cpp
# Opt level: O0

void compareDwa(int width,int height,Array2D<Imf_3_4::Rgba> *src,Array2D<Imf_3_4::Rgba> *test,
               RgbaChannels channels)

{
  uint16_t uVar1;
  Array2D<Imf_3_4::Rgba> *in_RCX;
  Array2D<Imf_3_4::Rgba> *in_RDX;
  int in_ESI;
  int in_EDI;
  uint in_R8D;
  float fVar2;
  float fVar3;
  double dVar4;
  undefined4 extraout_XMM0_Db;
  double dVar5;
  undefined4 extraout_XMM0_Db_00;
  undefined4 extraout_XMM0_Db_01;
  int x_1;
  int y_1;
  int comp;
  int x;
  int y;
  float relError;
  half testNonlin;
  half srcNonlin;
  float in_stack_ffffffffffffffa0;
  half in_stack_ffffffffffffffa4;
  undefined2 in_stack_ffffffffffffffa6;
  int local_50;
  int local_4c;
  int local_30;
  int local_2c;
  int local_28;
  half local_1e;
  uint local_1c;
  Array2D<Imf_3_4::Rgba> *local_18;
  Array2D<Imf_3_4::Rgba> *local_10;
  int local_8;
  int local_4;
  
  local_28 = 0;
  local_1c = in_R8D;
  local_18 = in_RCX;
  local_10 = in_RDX;
  local_8 = in_ESI;
  local_4 = in_EDI;
  do {
    if (local_8 <= local_28) {
      if ((local_1c & 8) != 0) {
        for (local_4c = 0; local_4c < local_8; local_4c = local_4c + 1) {
          for (local_50 = 0; local_50 < local_4; local_50 = local_50 + 1) {
            Imf_3_4::Array2D<Imf_3_4::Rgba>::operator[](local_10,(long)local_4c);
            fVar2 = Imath_3_2::half::operator_cast_to_float
                              ((half *)CONCAT26(in_stack_ffffffffffffffa6,
                                                CONCAT24(in_stack_ffffffffffffffa4._h,
                                                         in_stack_ffffffffffffffa0)));
            Imf_3_4::Array2D<Imf_3_4::Rgba>::operator[](local_18,(long)local_4c);
            fVar3 = Imath_3_2::half::operator_cast_to_float
                              ((half *)CONCAT26(in_stack_ffffffffffffffa6,
                                                CONCAT24(in_stack_ffffffffffffffa4._h,
                                                         in_stack_ffffffffffffffa0)));
            if ((fVar2 != fVar3) || (NAN(fVar2) || NAN(fVar3))) {
              __assert_fail("src[y][x].a == test[y][x].a",
                            "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/compareDwa.cpp"
                            ,0x6f,
                            "void compareDwa(int, int, const Array2D<Rgba> &, const Array2D<Rgba> &, RgbaChannels)"
                           );
            }
          }
        }
      }
      return;
    }
    for (local_2c = 0; local_2c < local_4; local_2c = local_2c + 1) {
      for (local_30 = 0; local_30 < 3; local_30 = local_30 + 1) {
        if (local_30 == 0) {
          if ((local_1c & 1) != 0) {
            Imf_3_4::Array2D<Imf_3_4::Rgba>::operator[](local_10,(long)local_28);
            local_1e._h = (uint16_t)toNonlinear(in_stack_ffffffffffffffa4);
            Imf_3_4::Array2D<Imf_3_4::Rgba>::operator[](local_18,(long)local_28);
            toNonlinear(in_stack_ffffffffffffffa4);
            goto LAB_0012832b;
          }
        }
        else {
          if (local_30 == 1) {
            if ((local_1c & 2) == 0) goto LAB_001284a5;
            Imf_3_4::Array2D<Imf_3_4::Rgba>::operator[](local_10,(long)local_28);
            local_1e._h = (uint16_t)toNonlinear(in_stack_ffffffffffffffa4);
            Imf_3_4::Array2D<Imf_3_4::Rgba>::operator[](local_18,(long)local_28);
            toNonlinear(in_stack_ffffffffffffffa4);
          }
          else if (local_30 == 2) {
            if ((local_1c & 4) == 0) goto LAB_001284a5;
            Imf_3_4::Array2D<Imf_3_4::Rgba>::operator[](local_10,(long)local_28);
            local_1e._h = (uint16_t)toNonlinear(in_stack_ffffffffffffffa4);
            Imf_3_4::Array2D<Imf_3_4::Rgba>::operator[](local_18,(long)local_28);
            toNonlinear(in_stack_ffffffffffffffa4);
          }
LAB_0012832b:
          uVar1 = Imath_3_2::half::bits(&local_1e);
          if (uVar1 == 0) {
            in_stack_ffffffffffffffa0 =
                 Imath_3_2::half::operator_cast_to_float
                           ((half *)CONCAT26(in_stack_ffffffffffffffa6,
                                             CONCAT24(in_stack_ffffffffffffffa4._h,
                                                      in_stack_ffffffffffffffa0)));
            fVar2 = Imath_3_2::half::operator_cast_to_float
                              ((half *)CONCAT26(in_stack_ffffffffffffffa6,
                                                CONCAT24(in_stack_ffffffffffffffa4._h,
                                                         in_stack_ffffffffffffffa0)));
            if ((in_stack_ffffffffffffffa0 == fVar2) &&
               (!NAN(in_stack_ffffffffffffffa0) && !NAN(fVar2))) {
              __assert_fail("srcNonlin != testNonlin",
                            "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/compareDwa.cpp"
                            ,0x61,
                            "void compareDwa(int, int, const Array2D<Rgba> &, const Array2D<Rgba> &, RgbaChannels)"
                           );
            }
          }
          else {
            fVar2 = Imath_3_2::half::operator_cast_to_float
                              ((half *)CONCAT26(in_stack_ffffffffffffffa6,
                                                CONCAT24(in_stack_ffffffffffffffa4._h,
                                                         in_stack_ffffffffffffffa0)));
            in_stack_ffffffffffffffa4._h = SUB42(fVar2,0);
            in_stack_ffffffffffffffa6 = (undefined2)((uint)fVar2 >> 0x10);
            fVar2 = Imath_3_2::half::operator_cast_to_float
                              ((half *)CONCAT26(in_stack_ffffffffffffffa6,
                                                CONCAT24(in_stack_ffffffffffffffa4._h,
                                                         in_stack_ffffffffffffffa0)));
            dVar4 = std::fabs((double)(ulong)(uint)((float)CONCAT22(in_stack_ffffffffffffffa6,
                                                                    in_stack_ffffffffffffffa4._h) -
                                                   fVar2));
            fVar2 = Imath_3_2::half::operator_cast_to_float
                              ((half *)CONCAT26(in_stack_ffffffffffffffa6,
                                                CONCAT24(in_stack_ffffffffffffffa4._h,
                                                         in_stack_ffffffffffffffa0)));
            dVar5 = std::fabs((double)CONCAT44(extraout_XMM0_Db,fVar2));
            fVar2 = SUB84(dVar4,0) / SUB84(dVar5,0);
            fVar3 = Imath_3_2::half::operator_cast_to_float
                              ((half *)CONCAT26(in_stack_ffffffffffffffa6,
                                                CONCAT24(in_stack_ffffffffffffffa4._h,
                                                         in_stack_ffffffffffffffa0)));
            dVar4 = std::fabs((double)CONCAT44(extraout_XMM0_Db_00,fVar3));
            if (0.1 <= SUB84(dVar4,0)) {
              fVar3 = Imath_3_2::half::operator_cast_to_float
                                ((half *)CONCAT26(in_stack_ffffffffffffffa6,
                                                  CONCAT24(in_stack_ffffffffffffffa4._h,
                                                           in_stack_ffffffffffffffa0)));
              dVar4 = std::fabs((double)CONCAT44(extraout_XMM0_Db_01,fVar3));
              if (0.25 <= SUB84(dVar4,0)) {
                if (0.1 <= fVar2) {
                  __assert_fail("relError < .1",
                                "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/compareDwa.cpp"
                                ,0x5f,
                                "void compareDwa(int, int, const Array2D<Rgba> &, const Array2D<Rgba> &, RgbaChannels)"
                               );
                }
              }
              else if (0.25 <= fVar2) {
                __assert_fail("relError < .25",
                              "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/compareDwa.cpp"
                              ,0x5e,
                              "void compareDwa(int, int, const Array2D<Rgba> &, const Array2D<Rgba> &, RgbaChannels)"
                             );
              }
            }
          }
        }
LAB_001284a5:
      }
    }
    local_28 = local_28 + 1;
  } while( true );
}

Assistant:

void
compareDwa (
    int                  width,
    int                  height,
    const Array2D<Rgba>& src,
    const Array2D<Rgba>& test,
    RgbaChannels         channels)
{
    half  srcNonlin, testNonlin;
    float relError;

    for (int y = 0; y < height; ++y)
    {
        for (int x = 0; x < width; ++x)
        {

            for (int comp = 0; comp < 3; ++comp)
            {
                switch (comp)
                {
                    case 0:
                        if (!(channels & WRITE_R)) continue;

                        srcNonlin  = toNonlinear (src[y][x].r);
                        testNonlin = toNonlinear (test[y][x].r);
                        break;
                    case 1:
                        if (!(channels & WRITE_G)) continue;

                        srcNonlin  = toNonlinear (src[y][x].g);
                        testNonlin = toNonlinear (test[y][x].g);
                        break;
                    case 2:
                        if (!(channels & WRITE_B)) continue;

                        srcNonlin  = toNonlinear (src[y][x].b);
                        testNonlin = toNonlinear (test[y][x].b);
                        break;
                }

                //
                // Try to compare with relative error. This breaks down
                // for small numbers, which could be quantiezed to 0
                // giving 100% error.
                //
                if (srcNonlin.bits () != 0x00)
                {

                    relError = fabs ((float) srcNonlin - (float) testNonlin) /
                               fabs ((float) srcNonlin);

                    if (fabs (srcNonlin) < .1) continue;

                    if (fabs (srcNonlin) < .25) { assert (relError < .25); }
                    else { assert (relError < .1); }
                }
                else { assert (srcNonlin != testNonlin); }
            }
        }
    }

    //
    // Test alpha, if necessary
    //
    if (channels & WRITE_A)
    {
        for (int y = 0; y < height; ++y)
        {
            for (int x = 0; x < width; ++x)
            {
                assert (src[y][x].a == test[y][x].a);
            }
        }
    }
}